

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_submit.c
# Opt level: O3

int nghttp2_submit_shutdown_notice(nghttp2_session *session)

{
  int iVar1;
  
  if (session->server == '\0') {
    return -0x207;
  }
  if (session->goaway_flags != '\0') {
    return 0;
  }
  iVar1 = nghttp2_session_add_goaway(session,0x7fffffff,0,(uint8_t *)0x0,0,'\x02');
  return iVar1;
}

Assistant:

int nghttp2_submit_shutdown_notice(nghttp2_session *session) {
  if (!session->server) {
    return NGHTTP2_ERR_INVALID_STATE;
  }
  if (session->goaway_flags) {
    return 0;
  }
  return nghttp2_session_add_goaway(session, (1u << 31) - 1, NGHTTP2_NO_ERROR,
                                    NULL, 0,
                                    NGHTTP2_GOAWAY_AUX_SHUTDOWN_NOTICE);
}